

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall
wabt::BlockExprBase<(wabt::ExprType)27>::~BlockExprBase(BlockExprBase<(wabt::ExprType)27> *this)

{
  BlockExprBase<(wabt::ExprType)27> *this_local;
  
  (this->super_ExprMixin<(wabt::ExprType)27>).super_Expr._vptr_Expr =
       (_func_int **)&PTR__BlockExprBase_00256c40;
  Block::~Block(&this->block);
  ExprMixin<(wabt::ExprType)27>::~ExprMixin(&this->super_ExprMixin<(wabt::ExprType)27>);
  return;
}

Assistant:

explicit BlockExprBase(const Location& loc = Location())
      : ExprMixin<TypeEnum>(loc) {}